

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  ulong uVar1;
  int32_t iVar2;
  undefined4 uVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  parasail_result_t *ppVar21;
  undefined1 (*ptr) [16];
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  uint uVar42;
  ulong uVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar59 [64];
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  undefined1 local_300 [32];
  undefined1 local_2c0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  int local_100;
  int iStack_fc;
  int iStack_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int iStack_e8;
  int iStack_e4;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_avx2_256_32_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_avx2_256_32_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_avx2_256_32_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_avx2_256_32_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_avx2_256_32_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_avx2_256_32_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_avx2_256_32_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar40 = _s1Len + 7;
  uVar17 = s2Len + 7;
  iVar34 = -open;
  iVar18 = matrix->min;
  uVar19 = 0x80000000 - iVar18;
  if (iVar18 != iVar34 && SBORROW4(iVar18,iVar34) == iVar18 + open < 0) {
    uVar19 = open | 0x80000000;
  }
  iVar37 = uVar19 + 1;
  iVar41 = 0x7ffffffe - matrix->max;
  iVar18 = gap * 8;
  local_2c0 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  local_1e0 = local_2c0;
  if (s1_beg == 0) {
    local_1e0._4_4_ = iVar18;
    local_1e0._0_4_ = iVar18;
    local_1e0._8_4_ = iVar18;
    local_1e0._12_4_ = iVar18;
    local_1e0._16_4_ = iVar18;
    local_1e0._20_4_ = iVar18;
    local_1e0._24_4_ = iVar18;
    local_1e0._28_4_ = iVar18;
  }
  local_200._0_8_ = CONCAT44(iVar37,iVar37);
  local_200._8_8_ = CONCAT44(iVar37,iVar37);
  local_200._16_8_ = CONCAT44(iVar37,iVar37);
  local_200._24_8_ = CONCAT44(iVar37,iVar37);
  local_220._8_8_ = local_200._8_8_;
  local_220._0_8_ = local_200._0_8_;
  local_220._16_8_ = local_200._16_8_;
  local_220._24_8_ = local_200._24_8_;
  local_1a0._8_8_ = local_200._8_8_;
  local_1a0._0_8_ = local_200._0_8_;
  local_1a0._16_8_ = local_200._16_8_;
  local_1a0._24_8_ = local_200._24_8_;
  local_240._8_8_ = local_200._8_8_;
  local_240._0_8_ = local_200._0_8_;
  local_240._16_8_ = local_200._16_8_;
  local_240._24_8_ = local_200._24_8_;
  local_1c0._8_8_ = local_200._8_8_;
  local_1c0._0_8_ = local_200._0_8_;
  local_1c0._16_8_ = local_200._16_8_;
  local_1c0._24_8_ = local_200._24_8_;
  if (s1_beg == 0) {
    iVar18 = iVar34 - gap;
    iVar25 = iVar34 + gap * -2;
    iVar30 = -(gap * 3 + open);
    auVar58 = vpinsrd_avx(ZEXT416((uint)(gap * -7)),gap * -6,1);
    auVar58 = vpinsrd_avx(auVar58,gap * -5,2);
    auVar58 = vpinsrd_avx(auVar58,iVar34,3);
    auVar8 = vpinsrd_avx(ZEXT416((uint)open),gap * 4,1);
    auVar8 = vpshufd_avx(auVar8,0x40);
    auVar58 = vpsubd_avx(auVar58,auVar8);
    auVar45._4_4_ = iVar30;
    auVar45._0_4_ = iVar30;
    auVar45._8_4_ = iVar30;
    auVar45._12_4_ = iVar30;
    auVar45._16_4_ = iVar30;
    auVar45._20_4_ = iVar30;
    auVar45._24_4_ = iVar30;
    auVar45._28_4_ = iVar30;
    auVar45 = vpblendd_avx2(ZEXT1632(auVar58),auVar45,0x10);
    auVar46._4_4_ = iVar25;
    auVar46._0_4_ = iVar25;
    auVar46._8_4_ = iVar25;
    auVar46._12_4_ = iVar25;
    auVar46._16_4_ = iVar25;
    auVar46._20_4_ = iVar25;
    auVar46._24_4_ = iVar25;
    auVar46._28_4_ = iVar25;
    auVar45 = vpblendd_avx2(auVar45,auVar46,0x20);
    auVar47._4_4_ = iVar18;
    auVar47._0_4_ = iVar18;
    auVar47._8_4_ = iVar18;
    auVar47._12_4_ = iVar18;
    auVar47._16_4_ = iVar18;
    auVar47._20_4_ = iVar18;
    auVar47._24_4_ = iVar18;
    auVar47._28_4_ = iVar18;
    auVar45 = vpblendd_avx2(auVar45,auVar47,0x40);
    auVar48._4_4_ = iVar34;
    auVar48._0_4_ = iVar34;
    auVar48._8_4_ = iVar34;
    auVar48._12_4_ = iVar34;
    auVar48._16_4_ = iVar34;
    auVar48._20_4_ = iVar34;
    auVar48._24_4_ = iVar34;
    auVar48._28_4_ = iVar34;
    local_2c0 = vpblendd_avx2(auVar45,auVar48,0x80);
  }
  auVar58 = in_ZMM11._0_16_;
  ppVar21 = parasail_result_new_table1(_s1Len,s2Len);
  if (ppVar21 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar21->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar21->flag | 0x8421002;
  uVar24 = (ulong)(s2Len + 0xe);
  ptr = (undefined1 (*) [16])parasail_memalign_int32_t(0x20,uVar24);
  ptr_00 = parasail_memalign_int32_t(0x20,uVar24);
  ptr_01 = parasail_memalign_int32_t(0x20,uVar24);
  if (ptr_01 == (int32_t *)0x0 || (ptr_00 == (int32_t *)0x0 || ptr == (undefined1 (*) [16])0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int32_t(0x20,(long)iVar40);
    if (ptr_02 == (int32_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar5 = matrix->mapper;
      uVar24 = 0;
      do {
        ptr_02[uVar24] = piVar5[(byte)_s1[uVar24]];
        uVar24 = uVar24 + 1;
      } while ((uint)_s1Len != uVar24);
    }
    iVar18 = _s1Len + 1U;
    if ((int)(_s1Len + 1U) < iVar40) {
      iVar18 = iVar40;
    }
    memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar18) * 4 + 4);
  }
  else {
    ptr_02 = (int32_t *)0x0;
  }
  local_a0._4_4_ = _s1Len;
  local_a0._0_4_ = _s1Len;
  local_a0._8_4_ = _s1Len;
  local_a0._12_4_ = _s1Len;
  local_a0._16_4_ = _s1Len;
  local_a0._20_4_ = _s1Len;
  local_a0._24_4_ = _s1Len;
  local_a0._28_4_ = _s1Len;
  auVar45 = vpcmpeqd_avx2(ZEXT432((uint)_s1Len),ZEXT432((uint)_s1Len));
  local_c0._4_4_ = s2Len;
  local_c0._0_4_ = s2Len;
  local_c0._8_4_ = s2Len;
  local_c0._12_4_ = s2Len;
  local_c0._16_4_ = s2Len;
  local_c0._20_4_ = s2Len;
  local_c0._24_4_ = s2Len;
  local_c0._28_4_ = s2Len;
  local_140 = vpaddd_avx2(local_a0,auVar45);
  local_120 = vpaddd_avx2(local_c0,auVar45);
  piVar5 = matrix->mapper;
  uVar39 = (ulong)(uint)s2Len;
  uVar24 = 0;
  do {
    *(int *)(ptr[1] + uVar24 * 4 + 0xc) = piVar5[(byte)_s2[uVar24]];
    uVar24 = uVar24 + 1;
  } while (uVar39 != uVar24);
  *(undefined1 (*) [16])(*ptr + 0xc) = (undefined1  [16])0x0;
  *ptr = (undefined1  [16])0x0;
  uVar19 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar17) {
    uVar19 = uVar17;
  }
  auVar45 = ZEXT1632(auVar58);
  local_100 = gap;
  iStack_fc = gap;
  iStack_f8 = gap;
  iStack_f4 = gap;
  iStack_f0 = gap;
  iStack_ec = gap;
  iStack_e8 = gap;
  iStack_e4 = gap;
  local_e0 = open;
  iStack_dc = open;
  iStack_d8 = open;
  iStack_d4 = open;
  iStack_d0 = open;
  iStack_cc = open;
  iStack_c8 = open;
  iStack_c4 = open;
  memset(ptr[1] + uVar39 * 4 + 0xc,0,(ulong)(~s2Len + uVar19) * 4 + 4);
  uVar24 = 0;
  iVar18 = iVar34;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar24 + 7] = iVar18;
      ptr_01[uVar24 + 7] = iVar37;
      uVar24 = uVar24 + 1;
      iVar18 = iVar18 - gap;
    } while (uVar39 != uVar24);
  }
  else {
    do {
      ptr_00[uVar24 + 7] = 0;
      ptr_01[uVar24 + 7] = iVar37;
      uVar24 = uVar24 + 1;
    } while (uVar39 != uVar24);
  }
  lVar22 = 0;
  do {
    ptr_00[lVar22] = iVar37;
    ptr_01[lVar22] = iVar37;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 7);
  lVar22 = uVar39 + 7;
  iVar18 = s2Len;
  do {
    ptr_00[lVar22] = iVar37;
    ptr_01[lVar22] = iVar37;
    lVar22 = lVar22 + 1;
    iVar18 = iVar18 + 1;
  } while (iVar18 < (int)uVar17);
  ptr_00[6] = 0;
  if (_s1Len < 1) {
    local_280._4_4_ = iVar37;
    local_280._0_4_ = iVar37;
    local_280._8_4_ = iVar37;
    local_280._12_4_ = iVar37;
    local_280._16_4_ = iVar37;
    local_280._20_4_ = iVar37;
    local_280._24_4_ = iVar37;
    local_280._28_4_ = iVar37;
    local_260._4_4_ = iVar41;
    local_260._0_4_ = iVar41;
    local_260._8_4_ = iVar41;
    local_260._12_4_ = iVar41;
    local_260._16_4_ = iVar41;
    local_260._20_4_ = iVar41;
    local_260._24_4_ = iVar41;
    local_260._28_4_ = iVar41;
    local_1a0 = local_280;
    local_240 = local_280;
    local_1c0 = local_280;
  }
  else {
    piVar5 = matrix->matrix;
    uVar19 = _s1Len - 1;
    local_280._4_4_ = iVar37;
    local_280._0_4_ = iVar37;
    local_280._8_4_ = iVar37;
    local_280._12_4_ = iVar37;
    local_280._16_4_ = iVar37;
    local_280._20_4_ = iVar37;
    local_280._24_4_ = iVar37;
    local_280._28_4_ = iVar37;
    auVar55 = ZEXT3264(local_280);
    local_160 = vpalignr_avx2(ZEXT1632(local_280._16_16_),local_280,4);
    uVar24 = 1;
    if (1 < (int)uVar17) {
      uVar24 = (ulong)uVar17;
    }
    uVar29 = (ulong)(uint)_s1Len;
    auVar54 = ZEXT3264(local_200);
    auVar53 = ZEXT3264(local_220);
    local_388 = uVar39 * 0x1c + -0x1c;
    lVar22 = uVar39 * 0x20;
    local_390 = uVar39 * 4 + -4;
    local_3a0 = uVar39 * 0x18 + -0x18;
    local_3a8 = uVar39 * 0x14 + -0x14;
    local_3b0 = uVar39 * 8 + -8;
    local_3b8 = uVar39 * 0x10 + -0x10;
    local_3c0 = uVar39 * 0xc + -0xc;
    local_300._8_8_ = 0x400000005;
    local_300._0_8_ = 0x600000007;
    local_300._16_8_ = 0x200000003;
    local_300._24_8_ = 1;
    auVar45 = vpcmpeqd_avx2(auVar45,auVar45);
    auVar59 = ZEXT3264(auVar45);
    local_180 = 8;
    uStack_17c = 8;
    uStack_178 = 8;
    uStack_174 = 8;
    uStack_170 = 8;
    uStack_16c = 8;
    uStack_168 = 8;
    uStack_164 = 8;
    local_260._4_4_ = iVar41;
    local_260._0_4_ = iVar41;
    local_260._12_4_ = iVar41;
    local_260._8_4_ = iVar41;
    local_260._20_4_ = iVar41;
    local_260._16_4_ = iVar41;
    local_260._28_4_ = iVar41;
    local_260._24_4_ = iVar41;
    auVar57 = ZEXT3264(local_280);
    auVar56 = ZEXT3264(local_280);
    local_398 = 0;
    uVar43 = 0;
    do {
      uVar27 = uVar43 | 3;
      uVar17 = (uint)uVar43;
      if (matrix->type == 0) {
        uVar20 = ptr_02[uVar43 + 1];
        uVar42 = ptr_02[uVar43 + 2];
        uVar31 = ptr_02[uVar27];
        uVar26 = ptr_02[uVar43 + 4];
        uVar35 = ptr_02[uVar43 + 5];
        uVar33 = ptr_02[uVar43 + 6];
        uVar23 = ptr_02[uVar43];
        uVar38 = ptr_02[uVar43 + 7];
      }
      else {
        uVar20 = uVar17 | 1;
        if (uVar29 <= (uVar43 | 1)) {
          uVar20 = uVar19;
        }
        uVar42 = uVar17 | 2;
        if (uVar29 <= (uVar43 | 2)) {
          uVar42 = uVar19;
        }
        uVar31 = uVar17 | 3;
        if (uVar29 <= uVar27) {
          uVar31 = uVar19;
        }
        uVar26 = uVar17 | 4;
        if (uVar29 <= (uVar43 | 4)) {
          uVar26 = uVar19;
        }
        uVar35 = uVar17 | 5;
        if (uVar29 <= (uVar43 | 5)) {
          uVar35 = uVar19;
        }
        uVar33 = uVar17 | 6;
        if (uVar29 <= (uVar43 | 6)) {
          uVar33 = uVar19;
        }
        uVar23 = uVar17;
        uVar38 = uVar17 | 7;
        if (uVar29 <= (uVar43 | 7)) {
          uVar38 = uVar19;
        }
      }
      iVar18 = matrix->size;
      uVar1 = uVar43 + 8;
      iVar40 = iVar34 - uVar17 * gap;
      iVar2 = ptr_00[6];
      auVar44._4_4_ = iVar2;
      auVar44._0_4_ = iVar2;
      auVar44._8_4_ = iVar2;
      auVar44._12_4_ = iVar2;
      auVar44._16_4_ = iVar2;
      auVar44._20_4_ = iVar2;
      auVar44._24_4_ = iVar2;
      auVar44._28_4_ = iVar2;
      ptr_00[6] = iVar34 - (int)uVar1 * gap;
      if (s1_beg != 0) {
        iVar40 = 0;
      }
      auVar49._4_4_ = iVar40;
      auVar49._0_4_ = iVar40;
      auVar49._8_4_ = iVar40;
      auVar49._12_4_ = iVar40;
      auVar49._16_4_ = iVar40;
      auVar49._20_4_ = iVar40;
      auVar49._24_4_ = iVar40;
      auVar49._28_4_ = iVar40;
      auVar45 = vpblendd_avx2(local_160,auVar49,0x80);
      auVar48 = vpblendd_avx2(local_160,auVar44,0x80);
      local_80 = vpcmpeqd_avx2(local_300,local_140);
      auVar47 = vpmovsxbd_avx2(ZEXT816(0xfffefdfcfbfaf9));
      auVar10._4_4_ = iVar37;
      auVar10._0_4_ = iVar37;
      auVar10._8_4_ = iVar37;
      auVar10._12_4_ = iVar37;
      auVar10._16_4_ = iVar37;
      auVar10._20_4_ = iVar37;
      auVar10._24_4_ = iVar37;
      auVar10._28_4_ = iVar37;
      uVar32 = 0;
      auVar46 = auVar10;
      do {
        auVar58 = vpinsrd_avx(ZEXT416((uint)piVar5[(long)(int)(uVar31 * iVar18) +
                                                   (long)*(int *)(ptr[1] + uVar32 * 4)]),
                              piVar5[(long)(int)(uVar42 * iVar18) +
                                     (long)*(int *)(ptr[1] + uVar32 * 4 + 4)],1);
        auVar58 = vpinsrd_avx(auVar58,piVar5[(long)(int)(uVar20 * iVar18) +
                                             (long)*(int *)(ptr[1] + uVar32 * 4 + 8)],2);
        auVar58 = vpinsrd_avx(auVar58,piVar5[(long)(int)(uVar23 * iVar18) +
                                             (long)*(int *)(ptr[1] + uVar32 * 4 + 0xc)],3);
        auVar8 = vpinsrd_avx(ZEXT416((uint)piVar5[(long)(int)(uVar38 * iVar18) +
                                                  (long)*(int *)(*ptr + uVar32 * 4)]),
                             piVar5[(long)(int)(uVar33 * iVar18) +
                                    (long)*(int *)(*ptr + uVar32 * 4 + 4)],1);
        auVar8 = vpinsrd_avx(auVar8,piVar5[(long)(int)(uVar35 * iVar18) +
                                           (long)*(int *)(*ptr + uVar32 * 4 + 8)],2);
        auVar8 = vpinsrd_avx(auVar8,piVar5[(long)(int)(uVar26 * iVar18) +
                                           (long)*(int *)(*ptr + uVar32 * 4 + 0xc)],3);
        auVar50._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar8;
        auVar50._16_16_ = ZEXT116(1) * auVar58;
        auVar49 = vpmovsxbd_avx2(ZEXT816(0x7060504030201));
        auVar11 = vpermd_avx2(auVar49,auVar45);
        auVar44 = vpaddd_avx2(auVar48,auVar50);
        iVar2 = ptr_00[uVar32 + 7];
        auVar51._4_4_ = iVar2;
        auVar51._0_4_ = iVar2;
        auVar51._8_4_ = iVar2;
        auVar51._12_4_ = iVar2;
        auVar51._16_4_ = iVar2;
        auVar51._20_4_ = iVar2;
        auVar51._24_4_ = iVar2;
        auVar51._28_4_ = iVar2;
        auVar48 = vpblendd_avx2(auVar11,auVar51,0x80);
        auVar46 = vpermd_avx2(auVar49,auVar46);
        iVar2 = ptr_01[uVar32 + 7];
        auVar52._4_4_ = iVar2;
        auVar52._0_4_ = iVar2;
        auVar52._8_4_ = iVar2;
        auVar52._12_4_ = iVar2;
        auVar52._16_4_ = iVar2;
        auVar52._20_4_ = iVar2;
        auVar52._24_4_ = iVar2;
        auVar52._28_4_ = iVar2;
        auVar49 = vpblendd_avx2(auVar46,auVar52,0x80);
        auVar9._4_4_ = iStack_dc;
        auVar9._0_4_ = local_e0;
        auVar9._8_4_ = iStack_d8;
        auVar9._12_4_ = iStack_d4;
        auVar9._16_4_ = iStack_d0;
        auVar9._20_4_ = iStack_cc;
        auVar9._24_4_ = iStack_c8;
        auVar9._28_4_ = iStack_c4;
        auVar46 = vpsubd_avx2(auVar48,auVar9);
        auVar11._4_4_ = iStack_fc;
        auVar11._0_4_ = local_100;
        auVar11._8_4_ = iStack_f8;
        auVar11._12_4_ = iStack_f4;
        auVar11._16_4_ = iStack_f0;
        auVar11._20_4_ = iStack_ec;
        auVar11._24_4_ = iStack_e8;
        auVar11._28_4_ = iStack_e4;
        auVar49 = vpsubd_avx2(auVar49,auVar11);
        auVar46 = vpmaxsd_avx2(auVar46,auVar49);
        auVar45 = vpsubd_avx2(auVar45,auVar9);
        auVar10 = vpsubd_avx2(auVar10,auVar11);
        auVar10 = vpmaxsd_avx2(auVar45,auVar10);
        auVar45 = vpmaxsd_avx2(auVar10,auVar46);
        auVar49 = vpmaxsd_avx2(auVar44,auVar45);
        auVar44 = vpcmpeqd_avx2(auVar47,auVar59._0_32_);
        auVar45 = vblendvps_avx(auVar49,local_2c0,auVar44);
        if (7 < uVar32) {
          local_260 = vpminsd_avx2(local_260,auVar45);
          local_280 = vpmaxsd_avx2(local_280,auVar45);
        }
        piVar6 = ((ppVar21->field_4).rowcols)->score_row;
        auVar58 = auVar45._16_16_;
        if (uVar32 < uVar39) {
          uVar3 = vextractps_avx(auVar58,3);
          *(undefined4 *)((long)piVar6 + uVar32 * 4 + local_398) = uVar3;
        }
        if (uVar32 - 1 < uVar39 && (uVar43 | 1) < uVar29) {
          uVar3 = vextractps_avx(auVar58,2);
          *(undefined4 *)((long)piVar6 + uVar32 * 4 + local_390) = uVar3;
        }
        if (((uVar43 | 2) < uVar29) && ((long)(uVar32 - 2) < (long)uVar39 && 1 < uVar32)) {
          uVar3 = vextractps_avx(auVar58,1);
          *(undefined4 *)((long)piVar6 + uVar32 * 4 + local_3b0) = uVar3;
        }
        if ((uVar27 < uVar29) && ((long)(uVar32 - 3) < (long)uVar39 && 2 < uVar32)) {
          *(int *)((long)piVar6 + uVar32 * 4 + local_3c0) = auVar45._16_4_;
        }
        if (((uVar43 | 4) < uVar29) && ((long)(uVar32 - 4) < (long)uVar39 && 3 < uVar32)) {
          *(int *)((long)piVar6 + uVar32 * 4 + local_3b8) = auVar45._12_4_;
        }
        if (((uVar43 | 5) < uVar29) && ((long)(uVar32 - 5) < (long)uVar39 && 4 < uVar32)) {
          *(int *)((long)piVar6 + uVar32 * 4 + local_3a8) = auVar45._8_4_;
        }
        if (((uVar43 | 6) < uVar29) && ((long)(uVar32 - 6) < (long)uVar39 && 5 < uVar32)) {
          *(int *)((long)piVar6 + uVar32 * 4 + local_3a0) = auVar45._4_4_;
        }
        auVar12._4_4_ = iVar37;
        auVar12._0_4_ = iVar37;
        auVar12._8_4_ = iVar37;
        auVar12._12_4_ = iVar37;
        auVar12._16_4_ = iVar37;
        auVar12._20_4_ = iVar37;
        auVar12._24_4_ = iVar37;
        auVar12._28_4_ = iVar37;
        auVar46 = vblendvps_avx(auVar46,auVar12,auVar44);
        if (6 < uVar32 && (uVar43 | 7) < uVar29) {
          *(int32_t *)((long)piVar6 + uVar32 * 4 + local_388) = auVar45._0_4_;
        }
        auVar13._4_4_ = iVar37;
        auVar13._0_4_ = iVar37;
        auVar13._8_4_ = iVar37;
        auVar13._12_4_ = iVar37;
        auVar13._16_4_ = iVar37;
        auVar13._20_4_ = iVar37;
        auVar13._24_4_ = iVar37;
        auVar13._28_4_ = iVar37;
        auVar10 = vblendvps_avx(auVar10,auVar13,auVar44);
        auVar11 = vpcmpgtd_avx2(local_a0,local_300);
        auVar9 = vpcmpeqd_avx2(auVar47,local_120);
        auVar44 = vpcmpgtd_avx2(local_c0,auVar47);
        auVar50 = vpcmpgtd_avx2(auVar45,auVar54._0_32_);
        auVar44 = vpandn_avx2(auVar47,auVar44);
        auVar44 = vpand_avx2(auVar44,local_80);
        auVar44 = vpand_avx2(auVar44,auVar50);
        auVar50 = vpcmpgtd_avx2(auVar45,auVar53._0_32_);
        auVar11 = vpand_avx2(auVar9,auVar11);
        auVar11 = vpand_avx2(auVar50,auVar11);
        local_200 = vblendvps_avx(auVar54._0_32_,auVar49,auVar44);
        auVar54 = ZEXT3264(local_200);
        auVar49 = vpand_avx2(auVar9,local_80);
        local_1a0 = vblendvps_avx(auVar57._0_32_,auVar45,auVar49);
        auVar57 = ZEXT3264(local_1a0);
        local_220 = vblendvps_avx(auVar53._0_32_,auVar45,auVar11);
        auVar53 = ZEXT3264(local_220);
        local_240 = vblendvps_avx(auVar56._0_32_,local_300,auVar11);
        auVar56 = ZEXT3264(local_240);
        local_1c0 = vblendvps_avx(auVar55._0_32_,auVar47,auVar44);
        auVar55 = ZEXT3264(local_1c0);
        ptr_00[uVar32] = auVar45._0_4_;
        ptr_01[uVar32] = auVar46._0_4_;
        auVar44 = vpcmpeqd_avx2(auVar50,auVar50);
        auVar59 = ZEXT3264(auVar44);
        auVar47 = vpsubd_avx2(auVar47,auVar44);
        uVar32 = uVar32 + 1;
      } while (uVar24 != uVar32);
      auVar16._8_4_ = 8;
      auVar16._0_8_ = 0x800000008;
      auVar16._12_4_ = 8;
      auVar16._16_4_ = 8;
      auVar16._20_4_ = 8;
      auVar16._24_4_ = 8;
      auVar16._28_4_ = 8;
      local_300 = vpaddd_avx2(local_300,auVar16);
      local_2c0 = vpsubd_avx2(local_2c0,local_1e0);
      local_388 = local_388 + lVar22;
      local_398 = local_398 + lVar22;
      local_390 = local_390 + lVar22;
      local_3a0 = local_3a0 + lVar22;
      local_3a8 = local_3a8 + lVar22;
      local_3b8 = local_3b8 + lVar22;
      local_3c0 = local_3c0 + lVar22;
      local_3b0 = local_3b0 + lVar22;
      uVar43 = uVar1;
    } while (uVar1 < uVar29);
  }
  lVar22 = 0;
  iVar25 = 0;
  iVar40 = 0;
  iVar18 = 0;
  iVar34 = iVar37;
  iVar30 = iVar37;
  iVar28 = iVar37;
  do {
    iVar36 = *(int *)(local_220 + lVar22 * 4);
    if (iVar30 < iVar36) {
      iVar40 = *(int *)(local_240 + lVar22 * 4);
      iVar25 = *(int *)(local_240 + lVar22 * 4);
      iVar30 = iVar36;
    }
    else if ((iVar36 == iVar30) &&
            (iVar4 = *(int *)(local_240 + lVar22 * 4), bVar7 = iVar4 < iVar40, iVar40 = iVar25,
            bVar7)) {
      iVar40 = iVar4;
      iVar25 = iVar4;
      iVar30 = iVar36;
    }
    if (iVar28 < *(int *)(local_200 + lVar22 * 4)) {
      iVar18 = *(int *)(local_1c0 + lVar22 * 4);
      iVar28 = *(int *)(local_200 + lVar22 * 4);
    }
    if (iVar34 < *(int *)(local_1a0 + lVar22 * 4)) {
      iVar34 = *(int *)(local_1a0 + lVar22 * 4);
    }
    lVar22 = lVar22 + 1;
  } while ((int)lVar22 != 8);
  iVar25 = iVar18;
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end != 0) goto LAB_007b49fb;
    iVar25 = s2Len + -1;
    if (s2_end != 0) {
      iVar25 = iVar18;
      iVar34 = iVar28;
    }
  }
  else {
    if (iVar28 < iVar30) {
LAB_007b49fb:
      iVar36 = s2Len + -1;
      goto LAB_007b4a47;
    }
    iVar34 = iVar28;
    if ((iVar30 == iVar28) && (iVar36 = s2Len + -1, iVar18 == iVar36)) goto LAB_007b4a47;
  }
  iVar30 = iVar34;
  iVar36 = iVar25;
  iVar40 = _s1Len - 1;
LAB_007b4a47:
  auVar14._4_4_ = iVar37;
  auVar14._0_4_ = iVar37;
  auVar14._8_4_ = iVar37;
  auVar14._12_4_ = iVar37;
  auVar14._16_4_ = iVar37;
  auVar14._20_4_ = iVar37;
  auVar14._24_4_ = iVar37;
  auVar14._28_4_ = iVar37;
  auVar45 = vpcmpgtd_avx2(auVar14,local_260);
  auVar15._4_4_ = iVar41;
  auVar15._0_4_ = iVar41;
  auVar15._8_4_ = iVar41;
  auVar15._12_4_ = iVar41;
  auVar15._16_4_ = iVar41;
  auVar15._20_4_ = iVar41;
  auVar15._24_4_ = iVar41;
  auVar15._28_4_ = iVar41;
  auVar46 = vpcmpgtd_avx2(local_280,auVar15);
  auVar45 = vpor_avx2(auVar45,auVar46);
  if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar45 >> 0x7f,0) != '\0') ||
        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar45 >> 0xbf,0) != '\0') ||
      (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar45[0x1f] < '\0') {
    *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
    iVar30 = 0;
    iVar36 = 0;
    iVar40 = 0;
  }
  ppVar21->score = iVar30;
  ppVar21->end_query = iVar40;
  ppVar21->end_ref = iVar36;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar21;
  }
  return ppVar21;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxHRow;
    __m256i vMaxHCol;
    __m256i vLastVal;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vGapN = s1_beg ? _mm256_set1_epi32(0) : _mm256_set1_epi32(gap*N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vILimit1 = _mm256_sub_epi32(vILimit, vOne);
    vJLimit = _mm256_set1_epi32(s2Len);
    vJLimit1 = _mm256_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm256_set1_epi32(0) : _mm256_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m256i vIltLimit = _mm256_cmplt_epi32_rpl(vI, vILimit);
        __m256i vIeqLimit1 = _mm256_cmpeq_epi32(vI, vILimit1);
        vNH = _mm256_srli_si256_rpl(vNH, 4);
        vNH = _mm256_insert_epi32_rpl(vNH, H_pr[-1], 7);
        vWH = _mm256_srli_si256_rpl(vWH, 4);
        vWH = _mm256_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m256i vJeqLimit1 = _mm256_cmpeq_epi32(vJ, vJLimit1);
                __m256i vJgtNegOne = _mm256_cmpgt_epi32(vJ, vNegOne);
                __m256i vJltLimit = _mm256_cmplt_epi32_rpl(vJ, vJLimit);
                __m256i cond_j = _mm256_and_si256(vIltLimit, vJeqLimit1);
                __m256i cond_i = _mm256_and_si256(vIeqLimit1,
                        _mm256_and_si256(vJgtNegOne, vJltLimit));
                __m256i cond_max_row = _mm256_cmpgt_epi32(vWH, vMaxHRow);
                __m256i cond_max_col = _mm256_cmpgt_epi32(vWH, vMaxHCol);
                __m256i cond_last_val = _mm256_and_si256(vIeqLimit1, vJeqLimit1);
                __m256i cond_all_row = _mm256_and_si256(cond_max_row, cond_i);
                __m256i cond_all_col = _mm256_and_si256(cond_max_col, cond_j);
                vMaxHRow = _mm256_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm256_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm256_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
        vIBoundary = _mm256_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}